

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm.c
# Opt level: O2

int disasm_jnb_bitaddr_offset(em8051 *aCPU,int aPosition,char *aBuffer)

{
  char baddr [16];
  
  bitaddr_memonic((uint)aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aPosition + 1U],baddr);
  sprintf(aBuffer,"JNB   %s, #%+d",baddr,
          (ulong)(uint)(int)(char)aCPU->mCodeMem
                                  [(long)aCPU->mCodeMemSize - 1U & (long)aPosition + 2U]);
  return 3;
}

Assistant:

static int disasm_jnb_bitaddr_offset(struct em8051 *aCPU, int aPosition, char *aBuffer)
{
    char baddr[16];
    bitaddr_memonic(aCPU->mCodeMem[(aPosition + 1)&(aCPU->mCodeMemSize-1)], baddr);
    sprintf(aBuffer,"JNB   %s, #%+d",        
        baddr,
        (signed char)aCPU->mCodeMem[(aPosition + 2)&(aCPU->mCodeMemSize-1)]);
    return 3;
}